

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O3

void __thiscall TldDSAsKey::Add(TldDSAsKey *this,TldDSAsKey *key)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = key->ds_count;
  uVar3 = key->count;
  uVar2 = this->ds_count;
  uVar4 = this->count;
  this->ds_count = uVar2 + uVar1;
  this->count = uVar4 + uVar3;
  if (key->algo_nb != 0) {
    uVar5 = this->algo_nb;
    uVar6 = 0;
    do {
      uVar7 = (ulong)uVar5;
      if (uVar5 == 0) {
LAB_0016cb46:
        this->algo_code[uVar7] = key->algo_code[uVar6];
        this->algo_count[uVar7] = key->algo_count[uVar6];
        uVar5 = uVar5 + 1;
        this->algo_nb = uVar5;
      }
      else {
        uVar8 = 0;
        do {
          if (this->algo_code[uVar8] == key->algo_code[uVar6]) {
            this->algo_count[uVar8] = this->algo_count[uVar8] + key->algo_count[uVar6];
            goto LAB_0016cb76;
          }
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
        if (uVar5 < 8) goto LAB_0016cb46;
      }
LAB_0016cb76:
      uVar6 = uVar6 + 1;
    } while (uVar6 < key->algo_nb);
  }
  return;
}

Assistant:

void TldDSAsKey::Add(TldDSAsKey * key)
{
    count += key->count;
    ds_count += key->ds_count;
    for (uint32_t i = 0; i < key->algo_nb; i++) {
        bool is_found = false;
        for (uint32_t j = 0; j < algo_nb; j++) {
            if (algo_code[j] == key->algo_code[i]) {
                algo_count[j] += key->algo_count[i];
                is_found = true;
                break;
            }
        }
        if (!is_found && algo_nb < 8) {
            algo_code[algo_nb] = key->algo_code[i];
            algo_count[algo_nb] = key->algo_count[i];
            algo_nb++;
        }
    }
}